

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O1

ssize_t __thiscall Database::read(Database *this,int __fd,void *__buf,size_t __nbytes)

{
  NodeData *pNVar1;
  long lVar2;
  undefined4 in_register_00000034;
  
  pthread_rwlock_rdlock((pthread_rwlock_t *)this);
  pNVar1 = IndexTree::search(this->index,(PolarString *)CONCAT44(in_register_00000034,__fd));
  lVar2 = (long)pNVar1->slice;
  if (lVar2 != -1) {
    std::__cxx11::string::_M_replace
              ((ulong)__buf,0,*(char **)((long)__buf + 8),
               (ulong)(this->slices[lVar2] + pNVar1->offset));
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return (ulong)(lVar2 == -1);
}

Assistant:

RetCode Database::read(const PolarString &key, std::string *value) {
    pthread_rwlock_rdlock(&rwlock);
//    printf("DB Shard %d read %s\n", id, key.data());
    auto result = index->search(key);
    if (__glibc_unlikely(result.slice == -1)) {
        pthread_rwlock_unlock(&rwlock);
//        printf("Not Found\n");
        return polar_race::kNotFound;
    }
    auto slice = slices[result.slice];
    value->assign(slice + result.offset, result.length);
//    printf("Found %s\n", value->c_str());
    pthread_rwlock_unlock(&rwlock);
    return polar_race::kSucc;
}